

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

uint16_t __thiscall CConnman::GetDefaultPort(CConnman *this,string *addr)

{
  bool bVar1;
  Network NVar2;
  uint16_t uVar3;
  long in_FS_OFFSET;
  CNetAddr a;
  CNetAddr local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&local_40);
  bVar1 = CNetAddr::SetSpecial(&local_40,addr);
  if (bVar1) {
    NVar2 = CNetAddr::GetNetwork(&local_40);
    if (NVar2 == NET_I2P) {
      uVar3 = 0;
      goto LAB_00176b42;
    }
  }
  uVar3 = this->m_params->nDefaultPort;
LAB_00176b42:
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_40.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

uint16_t CConnman::GetDefaultPort(const std::string& addr) const
{
    CNetAddr a;
    return a.SetSpecial(addr) ? GetDefaultPort(a.GetNetwork()) : m_params.GetDefaultPort();
}